

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O0

int get_next_relative_field_bit_offset
              (coda_cursor *cursor,int64_t *rel_bit_offset,int64_t *current_field_size)

{
  int iVar1;
  int local_364;
  undefined1 local_360 [4];
  int available;
  coda_cursor record_cursor;
  char *pcStack_48;
  int field_index;
  int64_t bit_size;
  int64_t prev_bit_offset;
  coda_type_record *record;
  coda_type_record_field *field;
  int64_t *current_field_size_local;
  int64_t *rel_bit_offset_local;
  coda_cursor *cursor_local;
  
  prev_bit_offset = (int64_t)cursor->stack[cursor->n + -2].type;
  record_cursor.stack[0x1f].bit_offset._4_4_ = (int)cursor->stack[cursor->n + -1].index + 1;
  field = (coda_type_record_field *)current_field_size;
  current_field_size_local = rel_bit_offset;
  rel_bit_offset_local = (int64_t *)cursor;
  if ((long)((coda_dynamic_type_struct *)(prev_bit_offset + 0x40))->definition <=
      (long)record_cursor.stack[0x1f].bit_offset._4_4_) {
    __assert_fail("field_index < record->num_fields",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                  ,0xa1,
                  "int get_next_relative_field_bit_offset(const coda_cursor *, int64_t *, int64_t *)"
                 );
  }
  record = *(coda_type_record **)
            (*(long *)(prev_bit_offset + 0x50) +
            (long)record_cursor.stack[0x1f].bit_offset._4_4_ * 8);
  if ((long)record->size_expr < 0) {
    bit_size = cursor->stack[cursor->n + -1].bit_offset - cursor->stack[cursor->n + -2].bit_offset;
    if (record->attributes == (coda_type_record *)0x0) {
      iVar1 = coda_cursor_get_bit_size(cursor,(int64_t *)&stack0xffffffffffffffb8);
      if (iVar1 == 0) {
        *current_field_size_local = (int64_t)(pcStack_48 + bit_size);
        if (field != (coda_type_record_field *)0x0) {
          field->name = pcStack_48;
        }
        cursor_local._4_4_ = 0;
      }
      else {
        cursor_local._4_4_ = -1;
      }
    }
    else {
      memcpy(local_360,cursor,0x310);
      record_cursor.product._0_4_ = (int)record_cursor.product + -1;
      if (field != (coda_type_record_field *)0x0) {
        field->name = (char *)0xffffffffffffffff;
      }
      if (record->bit_size != 0) {
        iVar1 = coda_expression_eval_bool
                          ((coda_expression *)record->bit_size,(coda_cursor *)local_360,&local_364);
        if (iVar1 != 0) {
          coda_add_error_message(" for available expression");
          coda_cursor_add_to_error_message((coda_cursor *)rel_bit_offset_local);
          return -1;
        }
        if (local_364 == 0) {
          *current_field_size_local = bit_size;
          return 0;
        }
      }
      iVar1 = coda_expression_eval_integer
                        ((coda_expression *)record->attributes,(coda_cursor *)local_360,
                         current_field_size_local);
      if (iVar1 == 0) {
        cursor_local._4_4_ = 0;
      }
      else {
        coda_add_error_message(" for offset expression");
        coda_cursor_add_to_error_message((coda_cursor *)rel_bit_offset_local);
        cursor_local._4_4_ = -1;
      }
    }
  }
  else {
    *rel_bit_offset = (int64_t)record->size_expr;
    if (current_field_size != (int64_t *)0x0) {
      *current_field_size = -1;
    }
    cursor_local._4_4_ = 0;
  }
  return cursor_local._4_4_;
}

Assistant:

static int get_next_relative_field_bit_offset(const coda_cursor *cursor, int64_t *rel_bit_offset,
                                              int64_t *current_field_size)
{
    coda_type_record_field *field;
    coda_type_record *record;
    int64_t prev_bit_offset;
    int64_t bit_size;
    int field_index;

    record = (coda_type_record *)cursor->stack[cursor->n - 2].type;
    field_index = cursor->stack[cursor->n - 1].index + 1;
    assert(field_index < record->num_fields);
    field = record->field[field_index];

    if (field->bit_offset >= 0)
    {
        /* use static offset */
        *rel_bit_offset = field->bit_offset;
        if (current_field_size != NULL)
        {
            *current_field_size = -1;   /* not calculated */
        }
        return 0;
    }

    prev_bit_offset = cursor->stack[cursor->n - 1].bit_offset - cursor->stack[cursor->n - 2].bit_offset;

    if (field->bit_offset_expr != NULL)
    {
        coda_cursor record_cursor;

        record_cursor = *cursor;
        record_cursor.n--;
        if (current_field_size != NULL)
        {
            *current_field_size = -1;   /* not calculated */
        }

        if (field->available_expr != NULL)
        {
            int available;

            if (coda_expression_eval_bool(field->available_expr, &record_cursor, &available) != 0)
            {
                coda_add_error_message(" for available expression");
                coda_cursor_add_to_error_message(cursor);
                return -1;
            }
            /* don't evaluate offset expression if field is not available! */
            if (!available)
            {
                /* the size of this field is zero, so just use the offset of the previous field */
                *rel_bit_offset = prev_bit_offset;
                return 0;
            }
        }
        /* determine offset using expr */
        if (coda_expression_eval_integer(field->bit_offset_expr, &record_cursor, rel_bit_offset) != 0)
        {
            coda_add_error_message(" for offset expression");
            coda_cursor_add_to_error_message(cursor);
            return -1;
        }
        return 0;
    }

    /* determine offset by using bit_offset of current field and adding its bit size */
    if (coda_cursor_get_bit_size(cursor, &bit_size) != 0)
    {
        return -1;
    }
    *rel_bit_offset = prev_bit_offset + bit_size;
    if (current_field_size != NULL)
    {
        *current_field_size = bit_size;
    }

    return 0;
}